

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O0

size_t fiobj_str_vprintf(FIOBJ dest,char *format,__va_list_tag *argv)

{
  size_t sVar1;
  undefined1 local_40 [8];
  fio_str_info_s state;
  __va_list_tag *argv_local;
  char *format_local;
  FIOBJ dest_local;
  
  state.data = (char *)argv;
  sVar1 = fiobj_type_is(dest,FIOBJ_T_STRING);
  if (sVar1 != 0) {
    if (*(char *)((dest & 0xfffffffffffffff8) + 0x11) == '\0') {
      *(undefined8 *)((dest & 0xfffffffffffffff8) + 8) = 0;
      fio_str_vprintf((fio_str_info_s *)local_40,
                      (fio_str_s_conflict *)((dest & 0xfffffffffffffff8) + 0x10),format,
                      (__va_list_tag *)state.data);
      dest_local = state.capa;
    }
    else {
      dest_local = 0;
    }
    return dest_local;
  }
  __assert_fail("FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_str.c"
                ,0x11b,"size_t fiobj_str_vprintf(FIOBJ, const char *, struct __va_list_tag *)");
}

Assistant:

size_t fiobj_str_vprintf(FIOBJ dest, const char *format, va_list argv) {
  assert(FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (obj2str(dest)->str.frozen)
    return 0;
  obj2str(dest)->hash = 0;
  fio_str_info_s state = fio_str_vprintf(&obj2str(dest)->str, format, argv);
  return state.len;
}